

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CoverpointSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverpointSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::DataTypeSyntax&,slang::syntax::NamedLabelSyntax*&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::syntax::CoverageIffClauseSyntax*&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          DataTypeSyntax *args_1,NamedLabelSyntax **args_2,Token *args_3,ExpressionSyntax *args_4,
          CoverageIffClauseSyntax **args_5,Token *args_6,
          SyntaxList<slang::syntax::MemberSyntax> *args_7,Token *args_8,Token *args_9)

{
  Token coverpoint;
  Token openBrace;
  Token closeBrace;
  Token emptySemi;
  CoverpointSyntax *this_00;
  
  this_00 = (CoverpointSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CoverpointSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (CoverpointSyntax *)allocateSlow(this,0xe8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  coverpoint.kind = args_3->kind;
  coverpoint._2_1_ = args_3->field_0x2;
  coverpoint.numFlags.raw = (args_3->numFlags).raw;
  coverpoint.rawLen = args_3->rawLen;
  coverpoint.info = args_3->info;
  emptySemi.kind = args_9->kind;
  emptySemi._2_1_ = args_9->field_0x2;
  emptySemi.numFlags.raw = (args_9->numFlags).raw;
  emptySemi.rawLen = args_9->rawLen;
  emptySemi.info = args_9->info;
  closeBrace.kind = args_8->kind;
  closeBrace._2_1_ = args_8->field_0x2;
  closeBrace.numFlags.raw = (args_8->numFlags).raw;
  closeBrace.rawLen = args_8->rawLen;
  closeBrace.info = args_8->info;
  openBrace.kind = args_6->kind;
  openBrace._2_1_ = args_6->field_0x2;
  openBrace.numFlags.raw = (args_6->numFlags).raw;
  openBrace.rawLen = args_6->rawLen;
  openBrace.info = args_6->info;
  slang::syntax::CoverpointSyntax::CoverpointSyntax
            (this_00,args,args_1,*args_2,coverpoint,args_4,*args_5,openBrace,args_7,closeBrace,
             emptySemi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }